

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_edge_detection.cpp
# Opt level: O1

bool edge_detection::DetectHorizontalEdge<double>(void)

{
  bool bVar1;
  uint32_t x;
  uint32_t y;
  uint8_t value;
  uint32_t uVar2;
  uint uVar3;
  pointer pPVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM4 [16];
  uint32_t roiHeight;
  uint32_t roiX;
  uint local_bc;
  uint32_t roiWidth;
  uint32_t roiY;
  ulong local_b0;
  EdgeDetectionBase<double> edgeDetection;
  Image image;
  EdgeParameter local_50;
  
  uVar2 = Test_Helper::runCount();
  bVar8 = uVar2 == 0;
  if (!bVar8) {
    uVar3 = 0;
    do {
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                ((ImageTemplate<unsigned_char> *)&edgeDetection,0,0,'\x01','\x01');
      Unit_Test::blackImage(&image,(Image *)&edgeDetection);
      edgeDetection.positiveEdgePoint.
      super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__ImageTemplate_00219948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear
                ((ImageTemplate<unsigned_char> *)&edgeDetection);
      local_bc = uVar3;
      Unit_Test::generateRoi(&image,&roiX,&roiY,&roiWidth,&roiHeight);
      y = roiY;
      x = roiX;
      uVar2 = roiHeight;
      auVar11 = in_ZMM1._0_16_;
      local_b0 = (ulong)roiWidth;
      bVar5 = 1 < roiX;
      bVar6 = roiX + 1 < image._width;
      bVar9 = roiX == 0;
      bVar7 = image._width <= roiWidth + 2 + roiX;
      if ((bVar6 && bVar5) || (bVar1 = false, !bVar7 && !bVar9)) {
        uVar3 = rand();
        value = (uint8_t)uVar3;
        if ((uVar3 & 0xc0) == 0) {
          value = '@';
        }
        Unit_Test::fillImage(&image,x,y,(uint32_t)local_b0,uVar2,value);
        edgeDetection.negativeEdgePoint.
        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        edgeDetection.negativeEdgePoint.
        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        edgeDetection.positiveEdgePoint.
        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        edgeDetection.positiveEdgePoint.
        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        edgeDetection.positiveEdgePoint.
        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        edgeDetection.negativeEdgePoint.
        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        in_ZMM1 = ZEXT1664(auVar11);
        EdgeParameter::EdgeParameter(&local_50,LEFT_TO_RIGHT,ANY,ALL,1,1,0,0,'\n');
        EdgeDetectionBase<double>::find
                  (&edgeDetection,&image,0,0,image._width,image._height,&local_50);
        if (((!bVar6 || !bVar5) ||
            (bVar1 = true,
            (long)edgeDetection.positiveEdgePoint.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)edgeDetection.positiveEdgePoint.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4 == (ulong)roiHeight)) &&
           ((bVar7 || bVar9 ||
            (bVar1 = true,
            (long)edgeDetection.negativeEdgePoint.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)edgeDetection.negativeEdgePoint.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4 == (ulong)roiHeight)))) {
          bVar5 = edgeDetection.positiveEdgePoint.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
                  edgeDetection.positiveEdgePoint.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
          if (!bVar5) {
            auVar15 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,roiX);
            auVar14._8_8_ = 0x7fffffffffffffff;
            auVar14._0_8_ = 0x7fffffffffffffff;
            auVar11._8_8_ = 0;
            auVar11._0_8_ =
                 (edgeDetection.positiveEdgePoint.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start)->x - auVar15._0_8_;
            auVar11 = vandpd_avx(auVar11,auVar14);
            dVar10 = auVar11._0_8_;
            pPVar4 = edgeDetection.positiveEdgePoint.
                     super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            while (in_ZMM1 = ZEXT1664(auVar11), dVar10 <= 1.0) {
              pPVar4 = pPVar4 + 1;
              bVar5 = pPVar4 == edgeDetection.positiveEdgePoint.
                                super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
              if (bVar5) break;
              auVar12._8_8_ = 0;
              auVar12._0_8_ = pPVar4->x - auVar15._0_8_;
              auVar11 = vandpd_avx(auVar12,auVar14);
              dVar10 = auVar11._0_8_;
            }
          }
          bVar1 = true;
          if ((bVar5) &&
             (bVar1 = false,
             edgeDetection.negativeEdgePoint.
             super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
             super__Vector_impl_data._M_start !=
             edgeDetection.negativeEdgePoint.
             super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish)) {
            auVar11 = vcvtusi2sd_avx512f(in_XMM4,(int)local_b0 + x);
            auVar15._8_8_ = 0x7fffffffffffffff;
            auVar15._0_8_ = 0x7fffffffffffffff;
            pPVar4 = edgeDetection.negativeEdgePoint.
                     super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            do {
              auVar13._8_8_ = 0;
              auVar13._0_8_ = pPVar4->x - auVar11._0_8_;
              auVar14 = vandpd_avx(auVar13,auVar15);
              in_ZMM1 = ZEXT1664(auVar14);
              if (1.0 < auVar14._0_8_) {
                bVar1 = true;
                break;
              }
              pPVar4 = pPVar4 + 1;
            } while (pPVar4 != edgeDetection.negativeEdgePoint.
                               super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
        if (edgeDetection.negativeEdgePoint.
            super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(edgeDetection.negativeEdgePoint.
                          super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (edgeDetection.positiveEdgePoint.
            super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(edgeDetection.positiveEdgePoint.
                          super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      image._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&image);
      if (bVar1) {
        return bVar8;
      }
      uVar3 = local_bc + 1;
      uVar2 = Test_Helper::runCount();
      bVar8 = uVar3 >= uVar2;
    } while (uVar3 < uVar2);
  }
  return bVar8;
}

Assistant:

bool DetectHorizontalEdge()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            PenguinV_Image::Image image = Unit_Test::blackImage();

            uint32_t roiX, roiY;
            uint32_t roiWidth, roiHeight;
            Unit_Test::generateRoi( image, roiX, roiY, roiWidth, roiHeight );

            const uint32_t roiXEnd = roiX + roiWidth;
            const bool isValidLeftEdge  = ( roiX > 1u ) && ( roiX    + 1u < image.width() );
            const bool isValidRightEdge = ( roiX > 0u ) && ( roiXEnd + 2u < image.width() );

            if ( !isValidLeftEdge && !isValidRightEdge )
                continue;

            Unit_Test::fillImage( image, roiX, roiY, roiWidth, roiHeight, Unit_Test::randomValue<uint8_t>( 64, 256 ) );

            EdgeDetectionBase<_Type> edgeDetection;
            edgeDetection.find( image, EdgeParameter( EdgeParameter::LEFT_TO_RIGHT) );

            const std::vector< PointBase2D<_Type> > & positive = edgeDetection.positiveEdge();
            const std::vector< PointBase2D<_Type> > & negative = edgeDetection.negativeEdge();

            if ( ( isValidLeftEdge && (positive.size() != roiHeight) ) || ( isValidRightEdge && (negative.size() != roiHeight) ) )
                return false;

            for ( typename std::vector< PointBase2D<_Type> >::const_iterator point = positive.cbegin(); point != positive.cend(); ++point ) {
                if ( fabs( point->x - roiX ) > 1.0 )
                    return false;
            }

            for ( typename std::vector< PointBase2D<_Type> >::const_iterator point = negative.cbegin(); point != negative.cend(); ++point ) {
                if ( fabs( point->x - roiXEnd ) > 1.0 )
                    return false;
            }
        }

        return true;
    }